

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O3

int Gia_ManSimSimulate(Gia_Man_t *pAig,Gia_ParSim_t *pPars)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Gia_ManSim_t *pGVar4;
  Abc_Cex_t *pAVar5;
  uint *puVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  int level;
  Gia_Man_t *pGVar10;
  Gia_Man_t *pAig_00;
  uint *puVar11;
  uint iFrame;
  int i;
  uint uVar12;
  long lVar13;
  double dVar14;
  timespec ts;
  timespec local_60;
  Gia_ManSim_t *local_50;
  long local_48;
  Gia_Man_t *local_40;
  double local_38;
  
  iVar2 = clock_gettime(3,&local_60);
  if (iVar2 < 0) {
    lVar13 = -1;
  }
  else {
    lVar13 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
  }
  iVar2 = pPars->TimeLimit;
  if ((long)iVar2 == 0) {
    lVar8 = 0;
  }
  else {
    iVar3 = clock_gettime(3,&local_60);
    if (iVar3 < 0) {
      lVar8 = -1;
    }
    else {
      lVar8 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
    }
    lVar8 = lVar8 + (long)iVar2 * 1000000;
  }
  if ((pAig->pReprs == (Gia_Rpr_t *)0x0) || (pAig->pNexts == (int *)0x0)) {
    if (pAig->pCexSeq != (Abc_Cex_t *)0x0) {
      free(pAig->pCexSeq);
      pAig->pCexSeq = (Abc_Cex_t *)0x0;
    }
    local_40 = pAig;
    pGVar4 = Gia_ManSimCreate(pAig,pPars);
    Gia_ManResetRandom(pPars);
    local_50 = pGVar4;
    Gia_ManSimInfoInit(pGVar4);
    local_48 = lVar13;
    if (pPars->nIters < 1) {
      iFrame = 0;
    }
    else {
      local_38 = (double)lVar13;
      iFrame = 0;
      do {
        pGVar4 = local_50;
        Gia_ManSimulateRound(local_50);
        if (pPars->fVerbose != 0) {
          Abc_Print((int)pGVar4,"Frame %4d out of %4d and timeout %3d sec. ",(ulong)(iFrame + 1),
                    (ulong)(uint)pPars->nIters,(ulong)(uint)pPars->TimeLimit);
          iVar3 = 3;
          iVar2 = clock_gettime(3,&local_60);
          dVar14 = -1.0;
          if (-1 < iVar2) {
            dVar14 = (double)(local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000);
          }
          Abc_Print(iVar3,"Time = %7.2f sec\r",(dVar14 - local_38) / 1000000.0);
        }
        if ((pPars->fCheckMiter != 0) &&
           (iVar2 = local_50->pAig->vCos->nSize, iVar3 = local_50->pAig->nRegs,
           uVar9 = iVar2 - iVar3, uVar9 != 0 && iVar3 <= iVar2)) {
          uVar1 = local_50->nWords;
          puVar6 = local_50->pDataSimCos;
          uVar7 = 0;
LAB_0071e4fe:
          if (0 < (int)uVar1) {
            lVar13 = 0;
            puVar11 = puVar6;
            do {
              if (*puVar11 != 0) {
                uVar12 = 0;
                goto LAB_0071e524;
              }
              lVar13 = lVar13 + -0x20;
              puVar11 = puVar11 + 1;
            } while ((ulong)uVar1 * 0x20 + lVar13 != 0);
          }
          goto LAB_0071e542;
        }
LAB_0071e54d:
        iVar2 = clock_gettime(3,&local_60);
        if (iVar2 < 0) {
          lVar13 = -1;
        }
        else {
          lVar13 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
        }
        if (lVar8 < lVar13) {
          iFrame = iFrame + 1;
          break;
        }
        iVar2 = pPars->nIters;
        if ((int)iFrame < iVar2 + -1) {
          Gia_ManSimInfoTransfer(local_50);
          iVar2 = pPars->nIters;
        }
        iFrame = iFrame + 1;
      } while ((int)iFrame < iVar2);
    }
    iVar2 = 0;
LAB_0071e64b:
    pGVar4 = local_50;
    Gia_ManSimDelete(local_50);
    if (local_40->pCexSeq == (Abc_Cex_t *)0x0) {
      Abc_Print((int)pGVar4,"No bug detected after simulating %d frames with %d words.  ",
                (ulong)iFrame,(ulong)(uint)pPars->nWords);
    }
    level = 3;
    iVar3 = clock_gettime(3,&local_60);
    if (iVar3 < 0) {
      lVar13 = -1;
    }
    else {
      lVar13 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
    }
    lVar13 = lVar13 - local_48;
    Abc_Print(level,"%s =","Time");
    Abc_Print(level,"%9.2f sec\n",(double)lVar13 / 1000000.0);
  }
  else {
    iVar2 = Gia_ManSimSimulateEquiv(pAig,pPars);
  }
  return iVar2;
  while (uVar12 = uVar12 + 1, uVar12 != 0x20) {
LAB_0071e524:
    if ((*puVar11 >> (uVar12 & 0x1f) & 1) != 0) goto LAB_0071e539;
  }
  uVar12 = 0xffffffff;
LAB_0071e539:
  if (-1 < (int)(uVar12 - (int)lVar13)) {
    Gia_ManResetRandom(pPars);
    pAig_00 = local_40;
    pPars->iOutFail = (int)uVar7;
    pGVar10 = local_40;
    pAVar5 = Gia_ManGenerateCounter
                       (local_40,iFrame,(int)uVar7,local_50->nWords,uVar12 - (int)lVar13,
                        local_50->vCis2Ids);
    pAig_00->pCexSeq = pAVar5;
    Abc_Print((int)pGVar10,"Output %d of miter \"%s\" was asserted in frame %d.  ",
              uVar7 & 0xffffffff,pAig_00->pName,(ulong)iFrame);
    iVar3 = Gia_ManVerifyCex(pAig_00,pAig_00->pCexSeq,0);
    iVar2 = 1;
    if (iVar3 == 0) {
      Abc_Print((int)pAig_00,"\nGenerated counter-example is INVALID.                    ");
    }
    goto LAB_0071e64b;
  }
LAB_0071e542:
  uVar7 = uVar7 + 1;
  puVar6 = puVar6 + (int)uVar1;
  if (uVar7 == uVar9) goto LAB_0071e54d;
  goto LAB_0071e4fe;
}

Assistant:

int Gia_ManSimSimulate( Gia_Man_t * pAig, Gia_ParSim_t * pPars )
{
    extern int Gia_ManSimSimulateEquiv( Gia_Man_t * pAig, Gia_ParSim_t * pPars );
    Gia_ManSim_t * p;
    abctime clkTotal = Abc_Clock();
    int i, iOut, iPat, RetValue = 0;
    abctime nTimeToStop = pPars->TimeLimit ? pPars->TimeLimit * CLOCKS_PER_SEC + Abc_Clock(): 0;
    if ( pAig->pReprs && pAig->pNexts )
        return Gia_ManSimSimulateEquiv( pAig, pPars );
    ABC_FREE( pAig->pCexSeq );
    p = Gia_ManSimCreate( pAig, pPars );
    Gia_ManResetRandom( pPars );
    Gia_ManSimInfoInit( p );
    for ( i = 0; i < pPars->nIters; i++ )
    {
        Gia_ManSimulateRound( p );
        if ( pPars->fVerbose )
        {
            Abc_Print( 1, "Frame %4d out of %4d and timeout %3d sec. ", i+1, pPars->nIters, pPars->TimeLimit );
            Abc_Print( 1, "Time = %7.2f sec\r", (1.0*Abc_Clock()-clkTotal)/CLOCKS_PER_SEC );
        }
        if ( pPars->fCheckMiter && Gia_ManCheckPos( p, &iOut, &iPat ) )
        {
            Gia_ManResetRandom( pPars );
            pPars->iOutFail = iOut;
            pAig->pCexSeq = Gia_ManGenerateCounter( pAig, i, iOut, p->nWords, iPat, p->vCis2Ids );
            Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.  ", iOut, pAig->pName, i );
            if ( !Gia_ManVerifyCex( pAig, pAig->pCexSeq, 0 ) )
            {
//                Abc_Print( 1, "\n" );
                Abc_Print( 1, "\nGenerated counter-example is INVALID.                    " );
//                Abc_Print( 1, "\n" );
            }
            else
            {
//                Abc_Print( 1, "\n" );
//                if ( pPars->fVerbose )
//                Abc_Print( 1, "\nGenerated counter-example is verified correctly.         " );
//                Abc_Print( 1, "\n" );
            }
            RetValue = 1;
            break;
        }
        if ( Abc_Clock() > nTimeToStop )
        {
            i++;
            break;
        }
        if ( i < pPars->nIters - 1 )
            Gia_ManSimInfoTransfer( p );
    }
    Gia_ManSimDelete( p );
    if ( pAig->pCexSeq == NULL )
        Abc_Print( 1, "No bug detected after simulating %d frames with %d words.  ", i, pPars->nWords );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
    return RetValue;
}